

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::BilinearPatch::CreatePatches
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
           *__return_storage_ptr__,BilinearPatchMesh *mesh,Allocator alloc)

{
  ulong uVar1;
  BilinearPatch *pBVar2;
  ulong uVar3;
  long lVar4;
  BilinearPatch *this;
  int vb;
  size_t va;
  BilinearPatchMesh *mesh_local;
  Allocator alloc_local;
  
  mesh_local = mesh;
  alloc_local = alloc;
  std::mutex::lock(&CreatePatches::allMeshesLock);
  uVar1 = allMeshes->nStored;
  vb = -0x80000000;
  va = uVar1;
  if (uVar1 < 0xffffffff80000000) {
    pstd::
    vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
    ::push_back(allMeshes,&mesh_local);
    pthread_mutex_unlock((pthread_mutex_t *)&CreatePatches::allMeshesLock);
    va = (size_t)alloc.memoryResource;
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::vector
              (__return_storage_ptr__,(long)mesh_local->nPatches,
               (polymorphic_allocator<pbrt::ShapeHandle> *)&va);
    pBVar2 = pstd::pmr::polymorphic_allocator<std::byte>::allocate_object<pbrt::BilinearPatch>
                       (&alloc_local,(long)mesh_local->nPatches);
    this = pBVar2;
    for (lVar4 = 0; lVar4 < mesh_local->nPatches; lVar4 = lVar4 + 1) {
      BilinearPatch(this,mesh_local,(int)uVar1,(int)lVar4);
      uVar3 = (ulong)pBVar2 | 0x5000000000000;
      pBVar2 = pBVar2 + 1;
      this = this + 1;
      __return_storage_ptr__->ptr[lVar4].
      super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
      .bits = uVar3;
    }
    return __return_storage_ptr__;
  }
  LogFatal<char_const(&)[18],char_const(&)[8],char_const(&)[18],unsigned_long&,char_const(&)[8],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
             ,0x3d9,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [18])"allMeshes->size()"
             ,(char (*) [8])"1 << 31",(char (*) [18])"allMeshes->size()",&va,(char (*) [8])"1 << 31"
             ,&vb);
}

Assistant:

pstd::vector<ShapeHandle> BilinearPatch::CreatePatches(const BilinearPatchMesh *mesh,
                                                       Allocator alloc) {
    static std::mutex allMeshesLock;
    allMeshesLock.lock();
    CHECK_LT(allMeshes->size(), 1 << 31);
    int meshIndex = int(allMeshes->size());
    allMeshes->push_back(mesh);
    allMeshesLock.unlock();

    pstd::vector<ShapeHandle> blps(mesh->nPatches, alloc);
    BilinearPatch *patches = alloc.allocate_object<BilinearPatch>(mesh->nPatches);
    for (int i = 0; i < mesh->nPatches; ++i) {
        alloc.construct(&patches[i], mesh, meshIndex, i);
        blps[i] = &patches[i];
    }

    return blps;
}